

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O3

void pstore::log<char_const*>(priority p,czstring message,char *d)

{
  undefined8 *puVar1;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  
  pstore::details::log_destinations::__tls_init();
  if (*(long *)(in_FS_OFFSET + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar1 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
    for (puVar2 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar2 != puVar1;
        puVar2 = puVar2 + 1) {
      (**(code **)(*(long *)*puVar2 + 0x50))((long *)*puVar2,p,message,d);
    }
  }
  return;
}

Assistant:

inline void log (logger::priority p, gsl::czstring message, T d) {
            if (details::log_destinations != nullptr) {
                for (std::unique_ptr<logger> & destination : *details::log_destinations) {
                    destination->log (p, message, d);
                }
            }
        }